

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O3

void TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int x;
  long lVar7;
  int x_2;
  long lVar8;
  int i;
  long lVar9;
  TPZVec<int> filtVecShape;
  ulong local_1e8;
  TPZVec<int> local_1c0;
  TPZVec<int> local_1a0;
  int aiStack_180 [12];
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  uVar2 = pztopology::TPZTetrahedron::NumSides(1);
  TPZVec<int>::TPZVec(&local_1a0,0);
  local_1a0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bdbf8;
  local_1a0.fStore = aiStack_180;
  local_1a0.fNElements = 0xb;
  local_1a0.fNAlloc = 0;
  aiStack_180[0] = 0;
  aiStack_180[1] = 0;
  aiStack_180[2] = 0;
  aiStack_180[3] = 0;
  aiStack_180[4] = 0;
  aiStack_180[5] = 0;
  aiStack_180[6] = 0;
  aiStack_180[7] = 0;
  aiStack_180[8] = 0;
  aiStack_180[9] = 0;
  aiStack_180[10] = 0;
  iVar3 = TPZShapeHCurl<pzshape::TPZShapeTetra>::ComputeNConnectShapeF
                    (0,*(data->fHDivConnectOrders).super_TPZVec<int>.fStore);
  lVar9 = 1;
  do {
    local_1a0.fStore[lVar9] = iVar3;
    iVar4 = TPZShapeHCurl<pzshape::TPZShapeTetra>::ComputeNConnectShapeF
                      ((int)lVar9,(data->fHDivConnectOrders).super_TPZVec<int>.fStore[lVar9]);
    iVar3 = iVar3 + iVar4;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xb);
  lVar9 = (long)iVar3;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar9;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (iVar3 != 0) {
    uVar5 = 0xffffffffffffffff;
    if ((ulong)(lVar9 * 3) < 0x2000000000000000) {
      uVar5 = lVar9 * 0x18;
    }
    local_c0.fElem = (double *)operator_new__(uVar5);
  }
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar9;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  local_1e8 = (ulong)uVar2;
  if (iVar3 != 0) {
    uVar5 = 0xffffffffffffffff;
    if ((ulong)(lVar9 * 3) < 0x2000000000000000) {
      uVar5 = lVar9 * 0x18;
    }
    local_150.fElem = (double *)operator_new__(uVar5);
  }
  TPZShapeHCurl<pzshape::TPZShapeTetra>::Shape(pt,data,&local_c0,&local_150);
  if ((int)uVar2 < 1) {
    local_1e8 = 0;
  }
  else {
    lVar9 = 0;
    uVar5 = 0;
    do {
      iVar3 = local_1a0.fStore[uVar5];
      lVar8 = (long)iVar3;
      lVar6 = lVar8 + 1;
      lVar7 = 0;
      do {
        if (((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) || (iVar3 < 0)) ||
           (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) || (iVar3 < -1))
           || (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar1 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar1 <= lVar7) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)((long)phi->fElem + lVar7 * 8 + lVar1 * lVar9) =
             local_c0.fElem
             [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8 + lVar7] +
             local_c0.fElem
             [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6 + lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar7 = 0;
      do {
        if (((local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) || (iVar3 < 0))
           || (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) || (iVar3 < -1))
           || (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar1 = (curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar1 <= lVar7) ||
           ((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)((long)curlphi->fElem + lVar7 * 8 + lVar1 * lVar9) =
             local_150.fElem
             [local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8 + lVar7] +
             local_150.fElem
             [local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6 + lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      uVar5 = uVar5 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar5 != local_1e8);
  }
  local_1c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  local_1c0.fStore = (int *)0x0;
  local_1c0.fNElements = 0;
  local_1c0.fNAlloc = 0;
  HighOrderFunctionsFilter(&local_1a0,&(data->fHDivConnectOrders).super_TPZVec<int>,&local_1c0);
  if (0 < local_1c0.fNElements) {
    lVar9 = local_1e8 * 8;
    lVar6 = 0;
    do {
      iVar3 = local_1c0.fStore[lVar6];
      lVar8 = (long)iVar3;
      lVar7 = 0;
      do {
        if (((local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) || (iVar3 < 0))
           || (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar1 = (curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar1 <= lVar7) ||
           ((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)local_1e8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)((long)curlphi->fElem + lVar7 * 8 + lVar1 * lVar9) =
             local_150.fElem
             [local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8 + lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar7 = 0;
      do {
        if (((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) || (iVar3 < 0)) ||
           (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar1 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar1 <= lVar7) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)local_1e8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)((long)phi->fElem + lVar7 * 8 + lVar1 * lVar9) =
             local_c0.fElem
             [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8 + lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_1e8 = local_1e8 + 1;
      lVar6 = lVar6 + 1;
      lVar9 = lVar9 + 8;
    } while (lVar6 != local_1c0.fNElements);
  }
  local_1c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  if (local_1c0.fStore != (int *)0x0) {
    operator_delete__(local_1c0.fStore);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  if (local_1a0.fStore != aiStack_180) {
    local_1a0.fNAlloc = 0;
    local_1a0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_1a0.fStore != (int *)0x0) {
      operator_delete__(local_1a0.fStore);
    }
  }
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int ncon = nsides - ncorner;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nedges = TSHAPE::NumSides(1);
    
    //calculates # of unfiltered hcurl functions
    const auto &connectorders = data.fHDivConnectOrders;
    //first_hcurl_side[i] is the index of the first shape function associated with side i
    TPZManVector<int,ncon> first_hcurl_side(ncon,0);
    //total number of unfiltered funcs
    int n_unfilt = 0;

    {
      n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(0,connectorders[0]);
      for (int i = 1; i < ncon; i++){
        first_hcurl_side[i] = n_unfilt;
        n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(i,connectorders[i]);
      }
    }
    
    //computes  unfiltered hcurl funcs
    TPZFMatrix<REAL> phi_unfilt(dim,n_unfilt), curlphi_unfilt(curldim,n_unfilt);
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi_unfilt, curlphi_unfilt);

    //now we filter the functions
    int fcount = 0;
    //edges: we sum the lowest order functions on the edge
    for(auto ie = 0; ie < nedges; ie++){
      //fss = first side shape
      const auto fss = first_hcurl_side[ie];
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fss) + phi_unfilt(x,fss+1);
      }
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fss) + curlphi_unfilt(x,fss+1);
      }
      fcount++;
    }
    if constexpr (dim < 2) return;

    TPZVec<int> filtVecShape;
    HighOrderFunctionsFilter(first_hcurl_side, connectorders,filtVecShape);

    const auto newfuncs = filtVecShape.size();
    
    for(int ifunc = 0; ifunc < newfuncs; ifunc++){
      const auto fi = filtVecShape[ifunc];
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fi);
      }
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fi);
      }
      fcount++;
    } 
    
    
}